

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

Quat __thiscall rw::Matrix::getRotation(Matrix *this)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Quat QVar6;
  
  fVar5 = (float)(this->right).x;
  fVar3 = (float)(this->up).y;
  fVar2 = (float)(this->at).z;
  fVar4 = fVar5 + fVar3 + fVar2;
  if (fVar4 <= 0.0) {
    if ((fVar5 <= fVar3) || (fVar5 <= fVar2)) {
      if (fVar3 <= fVar2) {
        fVar3 = ((fVar2 + 1.0) - fVar5) - fVar3;
        if (fVar3 < 0.0) {
          fVar3 = sqrtf(fVar3);
        }
        else {
          fVar3 = SQRT(fVar3);
        }
        fVar3 = fVar3 + fVar3;
        fVar5 = ((float)(this->right).y - (float)(this->up).x) / fVar3;
        uVar1 = CONCAT44(((float)(this->at).y + (float)(this->up).z) / fVar3,
                         ((float)(this->at).x + (float)(this->right).z) / fVar3);
        fVar3 = fVar3 * 0.25;
        goto LAB_00108bb2;
      }
      fVar2 = ((fVar3 + 1.0) - fVar5) - fVar2;
      if (fVar2 < 0.0) {
        fVar2 = sqrtf(fVar2);
      }
      else {
        fVar2 = SQRT(fVar2);
      }
      fVar4 = fVar2 + fVar2;
      fVar5 = ((float)(this->at).x - (float)(this->right).z) / fVar4;
      uVar1 = CONCAT44(fVar4 * 0.25,((float)(this->up).x + (float)(this->right).y) / fVar4);
      fVar3 = (float)(this->at).y + (float)(this->up).z;
    }
    else {
      fVar2 = ((fVar5 + 1.0) - fVar3) - fVar2;
      if (fVar2 < 0.0) {
        fVar2 = sqrtf(fVar2);
      }
      else {
        fVar2 = SQRT(fVar2);
      }
      fVar4 = fVar2 + fVar2;
      fVar5 = ((float)(this->up).z - (float)(this->at).y) / fVar4;
      uVar1 = CONCAT44(((float)(this->up).x + (float)(this->right).y) / fVar4,fVar4 * 0.25);
      fVar3 = (float)(this->at).x + (float)(this->right).z;
    }
  }
  else {
    fVar4 = fVar4 + 1.0;
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar4 = fVar4 + fVar4;
    fVar5 = fVar4 * 0.25;
    uVar1 = CONCAT44(((float)(this->at).x - (float)(this->right).z) / fVar4,
                     ((float)(this->up).z - (float)(this->at).y) / fVar4);
    fVar3 = (float)(this->right).y - (float)(this->up).x;
  }
  fVar3 = fVar3 / fVar4;
LAB_00108bb2:
  QVar6.w = (float32)fVar5;
  QVar6.z = (float32)fVar3;
  QVar6.x = (float32)(int)uVar1;
  QVar6.y = (float32)(int)((ulong)uVar1 >> 0x20);
  return QVar6;
}

Assistant:

Quat
Matrix::getRotation(void)
{
	Quat q = { 0.0f, 0.0f, 0.0f, 1.0f };
	float32 tr = right.x + up.y + at.z;
	float s;
	if(tr > 0.0f){
		s = sqrtf(1.0f + tr) * 2.0f;
		q.w = s / 4.0f;
		q.x = (up.z - at.y) / s;
		q.y = (at.x - right.z) / s;
		q.z = (right.y - up.x) / s;
	}else if(right.x > up.y && right.x > at.z){
		s = sqrtf(1.0f + right.x - up.y - at.z) * 2.0f;
		q.w = (up.z - at.y) / s;
		q.x = s / 4.0f;
		q.y = (up.x + right.y) / s;
		q.z = (at.x + right.z) / s;
	}else if(up.y > at.z){
		s = sqrtf(1.0f + up.y - right.x - at.z) * 2.0f;
		q.w = (at.x - right.z) / s;
		q.x = (up.x + right.y) / s;
		q.y = s / 4.0f;
		q.z = (at.y + up.z) / s;
	}else{
		s = sqrtf(1.0f + at.z - right.x - up.y) * 2.0f;
		q.w = (right.y - up.x) / s;
		q.x = (at.x + right.z) / s;
		q.y = (at.y + up.z) / s;
		q.z = s / 4.0f;
	}
	return q;
}